

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureMipmapTests.cpp
# Opt level: O2

void __thiscall
vkt::texture::anon_unknown_0::Texture3DLodControlTestInstance::Texture3DLodControlTestInstance
          (Texture3DLodControlTestInstance *this,Context *context,
          Texture3DMipmapTestCaseParameters *testParameters)

{
  TestTexture3DSp *this_00;
  uint uVar1;
  TestTexture3D *this_01;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  RGBA local_cc;
  PixelBufferAccess local_c8;
  TextureFormat local_a0 [2];
  Vector<float,_4> local_90;
  tcu local_80 [16];
  TextureFormatInfo fmtInfo;
  
  (this->super_TestInstance).m_context = context;
  (this->super_TestInstance)._vptr_TestInstance =
       (_func_int **)&PTR__Texture3DLodControlTestInstance_00c0c398;
  this->m_texWidth = 0x20;
  this->m_texHeight = 0x20;
  this->m_texDepth = 0x20;
  Texture3DMipmapTestCaseParameters::Texture3DMipmapTestCaseParameters
            (&this->m_testParameters,testParameters);
  this->m_minFilter =
       (testParameters->super_Texture3DTestCaseParameters).super_Texture2DTestCaseParameters.
       super_TextureCommonTestCaseParameters.minFilter;
  this_00 = &this->m_texture;
  de::SharedPtr<vkt::pipeline::TestTexture3D>::SharedPtr(this_00,(TestTexture3D *)0x0);
  util::TextureRenderer::TextureRenderer
            (&this->m_renderer,context,
             (testParameters->super_Texture3DTestCaseParameters).super_Texture2DTestCaseParameters.
             super_TextureCommonTestCaseParameters.sampleCount,this->m_texWidth << 2,
             this->m_texHeight << 2);
  local_c8.super_ConstPixelBufferAccess.m_format = ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
  tcu::getTextureFormatInfo(&fmtInfo,(TextureFormat *)&local_c8);
  uVar4 = this->m_texHeight;
  if (this->m_texHeight < this->m_texWidth) {
    uVar4 = this->m_texWidth;
  }
  if ((int)uVar4 <= this->m_texDepth) {
    uVar4 = this->m_texDepth;
  }
  if (uVar4 == 0) {
    uVar3 = 0x20;
  }
  else {
    uVar3 = 0x1f;
    if (uVar4 != 0) {
      for (; uVar4 >> uVar3 == 0; uVar3 = uVar3 - 1) {
      }
    }
    uVar3 = uVar3 ^ 0x1f;
  }
  this_01 = (TestTexture3D *)operator_new(0x78);
  local_a0[0] = ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
  vkt::pipeline::TestTexture3D::TestTexture3D
            (this_01,local_a0,this->m_texWidth,this->m_texHeight,this->m_texDepth);
  de::SharedPtr<vkt::pipeline::TestTexture3D>::SharedPtr
            ((SharedPtr<vkt::pipeline::TestTexture3D> *)&local_c8,this_01);
  de::SharedPtr<vkt::pipeline::TestTexture3D>::operator=
            (this_00,(SharedPtr<vkt::pipeline::TestTexture3D> *)&local_c8);
  de::SharedPtr<vkt::pipeline::TestTexture3D>::release
            ((SharedPtr<vkt::pipeline::TestTexture3D> *)&local_c8);
  for (uVar4 = 0; 0x20 - uVar3 != uVar4; uVar4 = uVar4 + 1) {
    (*(this_00->m_ptr->super_TestTexture)._vptr_TestTexture[7])
              (&local_c8,this_00->m_ptr,(ulong)uVar4,0);
    uVar1 = (int)(0xff / (long)(int)(0x1f - uVar3)) * uVar4;
    uVar2 = uVar1;
    if (0xfe < uVar1) {
      uVar2 = 0xff;
    }
    local_cc.m_value = uVar2 * 0x10100 ^ 0xff00ffff;
    if ((int)uVar1 < 0) {
      local_cc.m_value = 0xff00ffff;
    }
    tcu::RGBA::toVec(&local_cc);
    tcu::operator*(local_80,&local_90,&fmtInfo.lookupScale);
    tcu::operator+((tcu *)local_a0,(Vector<float,_4> *)local_80,&fmtInfo.lookupBias);
    tcu::clear(&local_c8,(Vec4 *)local_a0);
  }
  util::TextureRenderer::add3DTexture(&this->m_renderer,this_00);
  return;
}

Assistant:

Texture3DLodControlTestInstance::Texture3DLodControlTestInstance (Context& context, const Texture3DMipmapTestCaseParameters& testParameters)
	: TestInstance		(context)
	, m_texWidth		(32)
	, m_texHeight		(32)
	, m_texDepth		(32)
	, m_testParameters	(testParameters)
	, m_minFilter		(testParameters.minFilter)
	, m_texture			(DE_NULL)
	, m_renderer		(context, testParameters.sampleCount, m_texWidth*4, m_texHeight*4)
{
	const VkFormat			format		= VK_FORMAT_R8G8B8A8_UNORM;
	tcu::TextureFormatInfo	fmtInfo		= tcu::getTextureFormatInfo(mapVkFormat(format));
	const tcu::Vec4&		cScale		= fmtInfo.lookupScale;
	const tcu::Vec4&		cBias		= fmtInfo.lookupBias;
	const int				numLevels	= deLog2Floor32(de::max(de::max(m_texWidth, m_texHeight), m_texDepth))+1;

	m_texture = TestTexture3DSp(new pipeline::TestTexture3D(vk::mapVkFormat(format), m_texWidth, m_texHeight, m_texDepth));

	// Fill texture with colored grid.
	for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
	{
		const deUint32	step	= 0xff / (numLevels-1);
		const deUint32	inc		= deClamp32(step*levelNdx, 0x00, 0xff);
		const deUint32	dec		= 0xff - inc;
		const deUint32	rgb		= (inc << 16) | (dec << 8) | 0xff;
		const deUint32	color	= 0xff000000 | rgb;

		tcu::clear(m_texture->getLevel(levelNdx, 0), tcu::RGBA(color).toVec()*cScale + cBias);
	}

	m_renderer.add3DTexture(m_texture);
}